

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_encoding.h
# Opt level: O2

bool draco::EncodeVarint<unsigned_long>(unsigned_long val,EncoderBuffer *out_buffer)

{
  bool bVar1;
  undefined8 in_RAX;
  undefined8 uStack_18;
  
  uStack_18._0_7_ = (undefined7)in_RAX;
  uStack_18 = CONCAT17((char)val,(undefined7)uStack_18) & 0x7fffffffffffffff;
  if (val < 0x80) {
    bVar1 = EncoderBuffer::Encode<unsigned_char>(out_buffer,(uchar *)((long)&uStack_18 + 7));
  }
  else {
    uStack_18 = CONCAT17((char)val,(undefined7)uStack_18) | 0x8000000000000000;
    bVar1 = EncoderBuffer::Encode<unsigned_char>(out_buffer,(uchar *)((long)&uStack_18 + 7));
    if (bVar1) {
      bVar1 = EncodeVarint<unsigned_long>(val >> 7,out_buffer);
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool EncodeVarint(IntTypeT val, EncoderBuffer *out_buffer) {
  if (std::is_unsigned<IntTypeT>::value) {
    // Coding of unsigned values.
    // 0-6 bit - data
    // 7 bit - next byte?
    uint8_t out = 0;
    out |= val & ((1 << 7) - 1);
    if (val >= (1 << 7)) {
      out |= (1 << 7);
      if (!out_buffer->Encode(out)) {
        return false;
      }
      if (!EncodeVarint<IntTypeT>(val >> 7, out_buffer)) {
        return false;
      }
      return true;
    }
    if (!out_buffer->Encode(out)) {
      return false;
    }
  } else {
    // IntTypeT is a signed value. Convert to unsigned symbol and encode.
    const typename std::make_unsigned<IntTypeT>::type symbol =
        ConvertSignedIntToSymbol(val);
    if (!EncodeVarint(symbol, out_buffer)) {
      return false;
    }
  }
  return true;
}